

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SameValueComparer.h
# Opt level: O2

hash_t Js::SameValueComparerCommon<void_*,_true>::HashDouble(double d)

{
  BOOL BVar1;
  uint uVar2;
  double dVar3;
  
  BVar1 = JavascriptNumber::IsNan(d);
  uVar2 = 0;
  if (BVar1 == 0) {
    BVar1 = JavascriptNumber::IsNegZero(d);
    dVar3 = 0.0;
    if (BVar1 == 0) {
      dVar3 = d;
    }
    uVar2 = (uint)((ulong)dVar3 >> 0x20) ^ SUB84(dVar3,0);
  }
  return uVar2;
}

Assistant:

static hash_t HashDouble(double d)
        {
            if (JavascriptNumber::IsNan(d))
            {
                return 0;
            }

            if (zero)
            {
                // SameValueZero treats -0 and +0 the same, so normalize to get same hash code
                if (JavascriptNumber::IsNegZero(d))
                {
                    d = 0.0;
                }
            }

            __int64 v = *(__int64*)&d;
            return (uint)v ^ (uint)(v >> 32);
        }